

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

_lookup_path_token * __thiscall
c4::yml::Tree::_next_token(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  ro_substr chars;
  csubstr v;
  csubstr v_00;
  csubstr v_01;
  bool bVar1;
  error_flags eVar2;
  _lookup_path_token *in_RCX;
  long in_RSI;
  _lookup_path_token *in_RDI;
  char msg_2 [34];
  char msg_1 [25];
  char msg [55];
  NodeType t;
  size_t pos;
  csubstr idx;
  size_t pos_1;
  csubstr unres;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  lookup_result *in_stack_fffffffffffffb88;
  Tree *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  char *in_stack_fffffffffffffbc0;
  undefined1 *puVar3;
  size_t in_stack_fffffffffffffbc8;
  code *pcVar4;
  bool local_359;
  undefined1 local_358 [8];
  char *local_350;
  size_t local_348;
  undefined4 uStack_328;
  undefined4 uStack_324;
  lookup_result *local_320;
  undefined1 local_318 [48];
  undefined1 local_2e8 [8];
  char *local_2e0;
  size_t local_2d8;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  lookup_result *local_2b0;
  char local_2a8 [48];
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  lookup_result *local_260;
  undefined1 local_258 [56];
  undefined1 local_220 [8];
  char *local_218;
  size_t local_210;
  undefined1 local_208 [8];
  char *local_200;
  size_t local_1f8;
  undefined8 local_1f0;
  basic_substring<char_const> local_1e8 [16];
  size_t local_1d8;
  undefined1 local_1d0 [8];
  char *local_1c8;
  size_t local_1c0;
  char *local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  csubstr local_1a0;
  _lookup_path_token *local_190;
  csubstr *local_178;
  undefined8 local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 *local_128;
  NodeType *local_120;
  char *local_118;
  undefined4 local_110;
  ulong local_108;
  csubstr *local_100;
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  undefined4 local_e0;
  ulong local_d8;
  csubstr *local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  undefined4 local_b0;
  ulong local_a8;
  csubstr *local_a0;
  char *local_98;
  size_t local_90;
  undefined8 *local_88;
  char *local_80;
  undefined4 local_78;
  ulong local_70;
  csubstr *local_68;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  csubstr *local_48;
  char *local_40;
  undefined4 local_38;
  ulong local_30;
  csubstr *local_28;
  char *local_20;
  undefined4 local_18;
  size_t local_10;
  csubstr *local_8;
  
  local_190 = in_RCX;
  local_1a0 = lookup_result::unresolved
                        ((lookup_result *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  local_178 = &local_1a0;
  local_359 = true;
  if (local_1a0.len != 0) {
    local_359 = local_1a0.str == (char *)0x0;
  }
  if (local_359) {
    _lookup_path_token::_lookup_path_token
              ((_lookup_path_token *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  }
  else {
    bVar1 = basic_substring<const_char>::begins_with(&local_1a0,'[');
    if (bVar1) {
      local_1a8 = basic_substring<const_char>::find
                            ((basic_substring<const_char> *)
                             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             (char)((uint)in_stack_fffffffffffffb6c >> 0x18),0x2f7232);
      if (local_1a8 == 0xffffffffffffffff) {
        _lookup_path_token::_lookup_path_token
                  ((_lookup_path_token *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      }
      else {
        local_a8 = local_1a8 + 1;
        local_a0 = &local_1a0;
        if (local_1a0.len < local_a8 && local_a8 != 0xffffffffffffffff) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_b0 = 0x154e;
          handle_error(0x34dd90,(char *)0x154e,"check failed: %s","num <= len || num == npos");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)in_stack_fffffffffffffb90,
                   (char *)in_stack_fffffffffffffb88,
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        local_1b8 = local_98;
        local_1b0 = local_90;
        _advance(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        local_1c8 = local_1b8;
        local_1c0 = local_1b0;
        local_168 = local_1d0;
        local_170 = 2;
        v_01.len = local_1b0;
        v_01.str = local_1b8;
        _lookup_path_token::_lookup_path_token(in_RDI,v_01,(NodeType)0x2);
      }
    }
    else {
      basic_substring<char_const>::basic_substring<3ul>(local_1e8,(char (*) [3])".[");
      chars.len = in_stack_fffffffffffffbc8;
      chars.str = in_stack_fffffffffffffbc0;
      local_1d8 = basic_substring<const_char>::first_of
                            ((basic_substring<const_char> *)
                             CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),chars,
                             in_stack_fffffffffffffbb0);
      if (local_1d8 == 0xffffffffffffffff) {
        _advance(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        local_88 = &local_1f0;
        local_1f0 = 0;
        bVar1 = _lookup_path_token::operator_cast_to_bool(local_190);
        if ((bVar1) && (local_120 = &local_190->type, (local_120->type & SEQ) == NOTYPE)) {
          local_218 = local_1a0.str;
          local_210 = local_1a0.len;
          local_148 = local_220;
          local_150 = 3;
          _lookup_path_token::_lookup_path_token(in_RDI,local_1a0,(NodeType)0x3);
        }
        else {
          local_200 = local_1a0.str;
          local_1f8 = local_1a0.len;
          local_158 = local_208;
          local_160 = 1;
          _lookup_path_token::_lookup_path_token(in_RDI,local_1a0,(NodeType)0x1);
        }
      }
      else {
        local_8 = &local_1a0;
        local_10 = local_1d8;
        if (local_1a0.len <= local_1d8) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_20 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_18 = 0x14c3;
          handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        if (local_1a0.str[local_10] != '.') {
          local_28 = &local_1a0;
          local_30 = local_1d8;
          if (local_1a0.len <= local_1d8) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_38 = 0x14c3;
            handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          if (local_1a0.str[local_30] != '[') {
            memcpy(local_258,"check failed: (unres[pos] == \'.\' || unres[pos] == \'[\')",0x37);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar4 = *(code **)(in_RSI + 0x58);
            Location::Location((Location *)in_stack_fffffffffffffb90,
                               (char *)in_stack_fffffffffffffb88,
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            (*pcVar4)(local_258,0x37,*(undefined8 *)(in_RSI + 0x40));
            in_stack_fffffffffffffb70 = uStack_278;
            in_stack_fffffffffffffb74 = uStack_274;
            in_stack_fffffffffffffb78 = local_270;
            in_stack_fffffffffffffb7c = uStack_26c;
            in_stack_fffffffffffffb80 = uStack_268;
            in_stack_fffffffffffffb84 = uStack_264;
            in_stack_fffffffffffffb88 = local_260;
          }
        }
        local_48 = &local_1a0;
        local_50 = local_1d8;
        if (local_1a0.len <= local_1d8) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_60 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_58 = 0x14c3;
          handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        if (local_1a0.str[local_50] == '.') {
          if (local_1d8 == 0) {
            builtin_strncpy(local_2a8,"check failed: (pos != 0)",0x19);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar4 = *(code **)(in_RSI + 0x58);
            Location::Location((Location *)in_stack_fffffffffffffb90,
                               (char *)in_stack_fffffffffffffb88,
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            (*pcVar4)(local_2a8,0x19,*(undefined8 *)(in_RSI + 0x40));
            in_stack_fffffffffffffb80 = uStack_2b8;
            in_stack_fffffffffffffb84 = uStack_2b4;
            in_stack_fffffffffffffb88 = local_2b0;
          }
          _advance(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_d0 = &local_1a0;
          local_d8 = local_1d8;
          if (local_1a0.len < local_1d8 && local_1d8 != 0xffffffffffffffff) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_e0 = 0x154e;
            handle_error(0x34dd90,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffffb90,
                     (char *)in_stack_fffffffffffffb88,
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_2e0 = local_c8;
          local_2d8 = local_c0;
          local_138 = local_2e8;
          local_140 = 4;
          v_00.len = local_c0;
          v_00.str = local_c8;
          _lookup_path_token::_lookup_path_token(in_RDI,v_00,(NodeType)0x4);
        }
        else {
          local_68 = &local_1a0;
          local_70 = local_1d8;
          if (local_1a0.len <= local_1d8) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_80 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_78 = 0x14c3;
            handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          if (local_1a0.str[local_70] != '[') {
            memcpy(local_318,"check failed: (unres[pos] == \'[\')",0x22);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar4 = *(code **)(in_RSI + 0x58);
            puVar3 = local_318;
            Location::Location((Location *)in_stack_fffffffffffffb90,
                               (char *)in_stack_fffffffffffffb88,
                               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            (*pcVar4)(puVar3,0x22,*(undefined8 *)(in_RSI + 0x40));
            in_stack_fffffffffffffb80 = uStack_328;
            in_stack_fffffffffffffb84 = uStack_324;
            in_stack_fffffffffffffb88 = local_320;
          }
          _advance(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_100 = &local_1a0;
          local_108 = local_1d8;
          if (local_1a0.len < local_1d8 && local_1d8 != 0xffffffffffffffff) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_118 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_110 = 0x154e;
            handle_error(0x34dd90,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffffb90,
                     (char *)in_stack_fffffffffffffb88,
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_350 = local_f8;
          local_348 = local_f0;
          local_128 = local_358;
          local_130 = 8;
          v.len = local_f0;
          v.str = local_f8;
          _lookup_path_token::_lookup_path_token(in_RDI,v,(NodeType)0x8);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Tree::_lookup_path_token Tree::_next_token(lookup_result *r, _lookup_path_token const& parent) const
{
    csubstr unres = r->unresolved();
    if(unres.empty())
        return {};

    // is it an indexation like [0], [1], etc?
    if(unres.begins_with('['))
    {
        size_t pos = unres.find(']');
        if(pos == csubstr::npos)
            return {};
        csubstr idx = unres.first(pos + 1);
        _advance(r, pos + 1);
        return {idx, KEY};
    }

    // no. so it must be a name
    size_t pos = unres.first_of(".[");
    if(pos == csubstr::npos)
    {
        _advance(r, unres.len);
        NodeType t;
        if(( ! parent) || parent.type.is_seq())
            return {unres, VAL};
        return {unres, KEYVAL};
    }

    // it's either a map or a seq
    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '.' || unres[pos] == '[');
    if(unres[pos] == '.')
    {
        _RYML_CB_ASSERT(m_callbacks, pos != 0);
        _advance(r, pos + 1);
        return {unres.first(pos), MAP};
    }

    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '[');
    _advance(r, pos);
    return {unres.first(pos), SEQ};
}